

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_regexp_get_source(JSContext *ctx,JSValue this_val)

{
  JSValue obj;
  JSValue op1;
  BOOL BVar1;
  uint uVar2;
  int idx;
  int iVar3;
  int iVar4;
  JSRegExp *pJVar5;
  int in_EDX;
  JSValue JVar6;
  int bra;
  int c2;
  int c;
  int n;
  int i;
  StringBuffer *b;
  StringBuffer b_s;
  JSString *p;
  JSRegExp *re;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int iVar7;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  JSContext *ctx_00;
  JSContext *in_stack_ffffffffffffffa8;
  JSValueUnion in_stack_ffffffffffffffb0;
  JSValueUnion in_stack_ffffffffffffffb8;
  JSRuntime *in_stack_ffffffffffffffc0;
  JSValueUnion in_stack_ffffffffffffffc8;
  JSString *p_00;
  list_head *in_stack_ffffffffffffffd0;
  JSValueUnion local_10;
  int64_t local_8;
  
  ctx_00 = (JSContext *)&stack0xffffffffffffffa8;
  if (in_EDX != -1) {
    JVar6 = JS_ThrowTypeErrorNotAnObject((JSContext *)0x16f8a1);
    return JVar6;
  }
  op1.tag = (int64_t)in_stack_ffffffffffffffd0;
  op1.u.float64 = in_stack_ffffffffffffffc8.float64;
  JVar6.tag = (int64_t)in_stack_ffffffffffffffc0;
  JVar6.u.ptr = in_stack_ffffffffffffffb8.ptr;
  BVar1 = js_same_value((JSContext *)in_stack_ffffffffffffffb0.ptr,op1,JVar6);
  if (BVar1 == 0) {
    obj.tag = (int64_t)in_stack_ffffffffffffffb8.ptr;
    obj.u.ptr = in_stack_ffffffffffffffb0.ptr;
    pJVar5 = js_get_regexp(in_stack_ffffffffffffffa8,obj,(BOOL)((ulong)ctx_00 >> 0x20));
    if (pJVar5 == (JSRegExp *)0x0) {
      local_10.ptr = (void *)(local_10 << 0x20);
      local_8 = 6;
      return _local_10;
    }
    p_00 = pJVar5->pattern;
    if ((*(ulong *)&p_00->field_0x4 & 0x7fffffff) != 0) {
      string_buffer_init2((JSContext *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                          ,(StringBuffer *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      iVar7 = 0;
      uVar2 = (uint)*(undefined8 *)&p_00->field_0x4 & 0x7fffffff;
      iVar4 = 0;
      while (iVar4 < (int)uVar2) {
        in_stack_ffffffffffffff90 = -1;
        idx = iVar4 + 1;
        iVar3 = string_get(p_00,iVar4);
        if (iVar3 == 10) {
          in_stack_ffffffffffffff90 = 0x6e;
          in_stack_ffffffffffffff94 = 0x5c;
        }
        else if (iVar3 == 0xd) {
          in_stack_ffffffffffffff90 = 0x72;
          in_stack_ffffffffffffff94 = 0x5c;
        }
        else {
          in_stack_ffffffffffffff94 = iVar3;
          if (iVar3 == 0x2f) {
            if (iVar7 == 0) {
              in_stack_ffffffffffffff90 = 0x2f;
              in_stack_ffffffffffffff94 = 0x5c;
            }
          }
          else if (iVar3 == 0x5b) {
            if (iVar7 == 0) {
              iVar4 = idx;
              if ((idx < (int)uVar2) && (iVar7 = string_get(p_00,idx), iVar4 = idx, iVar7 == 0x5d))
              {
                iVar4 = idx + 1;
                in_stack_ffffffffffffff90 = string_get(p_00,idx);
              }
              iVar7 = 1;
              idx = iVar4;
            }
          }
          else if (iVar3 == 0x5c) {
            if (idx < (int)uVar2) {
              iVar4 = idx + 1;
              in_stack_ffffffffffffff90 = string_get(p_00,idx);
              idx = iVar4;
            }
          }
          else if (iVar3 == 0x5d) {
            iVar7 = 0;
          }
        }
        string_buffer_putc16((StringBuffer *)CONCAT44(iVar7,iVar3),0);
        iVar4 = idx;
        if (-1 < in_stack_ffffffffffffff90) {
          string_buffer_putc16((StringBuffer *)CONCAT44(iVar7,iVar3),0);
          iVar4 = idx;
        }
      }
      JVar6 = string_buffer_end((StringBuffer *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      return JVar6;
    }
  }
  JVar6 = JS_NewString(ctx_00,(char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
  ;
  return JVar6;
}

Assistant:

static JSValue js_regexp_get_source(JSContext *ctx, JSValueConst this_val)
{
    JSRegExp *re;
    JSString *p;
    StringBuffer b_s, *b = &b_s;
    int i, n, c, c2, bra;

    if (JS_VALUE_GET_TAG(this_val) != JS_TAG_OBJECT)
        return JS_ThrowTypeErrorNotAnObject(ctx);

    if (js_same_value(ctx, this_val, ctx->class_proto[JS_CLASS_REGEXP]))
        goto empty_regex;

    re = js_get_regexp(ctx, this_val, TRUE);
    if (!re)
        return JS_EXCEPTION;

    p = re->pattern;

    if (p->len == 0) {
    empty_regex:
        return JS_NewString(ctx, "(?:)");
    }    
    string_buffer_init2(ctx, b, p->len, p->is_wide_char);

    /* Escape '/' and newline sequences as needed */
    bra = 0;
    for (i = 0, n = p->len; i < n;) {
        c2 = -1;
        switch (c = string_get(p, i++)) {
        case '\\':
            if (i < n)
                c2 = string_get(p, i++);
            break;
        case ']':
            bra = 0;
            break;
        case '[':
            if (!bra) {
                if (i < n && string_get(p, i) == ']')
                    c2 = string_get(p, i++);
                bra = 1;
            }
            break;
        case '\n':
            c = '\\';
            c2 = 'n';
            break;
        case '\r':
            c = '\\';
            c2 = 'r';
            break;
        case '/':
            if (!bra) {
                c = '\\';
                c2 = '/';
            }
            break;
        }
        string_buffer_putc16(b, c);
        if (c2 >= 0)
            string_buffer_putc16(b, c2);
    }
    return string_buffer_end(b);
}